

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

int Assimp_CompareDump(char **params,uint num)

{
  char *__s1;
  int iVar1;
  ostream *poVar2;
  FILE *actual_00;
  file_ptr expected;
  file_ptr actual;
  comparer_context comp;
  
  __s1 = *params;
  if (((((num == 1) && (*__s1 == '-')) && (__s1[1] == 'h')) && (__s1[2] == '\0')) ||
     ((iVar1 = strcmp(__s1,"--help"), iVar1 == 0 ||
      (((*__s1 == '-' && (__s1[1] == '?')) && (__s1[2] == '\0')))))) {
    printf("%s",AICMD_MSG_CMPDUMP_HELP);
    return 0;
  }
  if (num < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "assimp cmpdump: Invalid number of arguments. See \'assimp cmpdump --help\'\r\n"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    return 1;
  }
  iVar1 = strcmp(__s1,params[1]);
  if (iVar1 != 0) {
    actual_00 = fopen(__s1,"rb");
    actual.m_file = (FILE *)actual_00;
    if (actual_00 == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "assimp cmpdump: Failure reading ACTUAL data from ");
      poVar2 = std::operator<<(poVar2,*params);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar1 = -5;
    }
    else {
      expected.m_file = (FILE *)fopen(params[1],"rb");
      if ((FILE *)expected.m_file == (FILE *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "assimp cmpdump: Failure reading EXPECT data from ");
        poVar2 = std::operator<<(poVar2,params[1]);
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar1 = -6;
      }
      else {
        comparer_context::comparer_context(&comp,(FILE *)actual_00,expected.m_file);
        CheckHeader(&comp);
        CompareOnTheFly(&comp);
        poVar2 = std::operator<<((ostream *)&std::cout,"Success (totally ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," chunks)");
        iVar1 = 0;
        std::endl<char,std::char_traits<char>>(poVar2);
        comparer_context::~comparer_context(&comp);
      }
      Assimp_CompareDump::file_ptr::~file_ptr(&expected);
    }
    Assimp_CompareDump::file_ptr::~file_ptr(&actual);
    return iVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"assimp cmpdump: same file, same content.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int Assimp_CompareDump (const char* const* params, unsigned int num)
{
    // --help
    if ((num == 1 && !strcmp( params[0], "-h")) || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_CMPDUMP_HELP);
        return 0;
    }

    // assimp cmpdump actual expected
    if (num < 2) {
        std::cout << "assimp cmpdump: Invalid number of arguments. "
            "See \'assimp cmpdump --help\'\r\n" << std::endl;
        return 1;
    }

    if(!strcmp(params[0],params[1])) {
        std::cout << "assimp cmpdump: same file, same content." << std::endl;
        return 0;
    }

    class file_ptr
    {
    public:
        file_ptr(FILE *p)
            : m_file(p)
        {}
        ~file_ptr()
        {
            if (m_file)
            {
                fclose(m_file);
                m_file = NULL;
            }
        }

        operator FILE *() { return m_file; }

    private:
        FILE *m_file;
    };
    file_ptr actual(fopen(params[0],"rb"));
    if (!actual) {
        std::cout << "assimp cmpdump: Failure reading ACTUAL data from " <<
            params[0]  << std::endl;
        return -5;
    }
    file_ptr expected(fopen(params[1],"rb"));
    if (!expected) {
        std::cout << "assimp cmpdump: Failure reading EXPECT data from " <<
            params[1]  << std::endl;
        return -6;
    }

    comparer_context comp(actual,expected);
    try {
        CheckHeader(comp);
        CompareOnTheFly(comp);
    }
    catch(const compare_fails_exception& ex) {
        printf("%s",ex.what());
        return -1;
    }
    catch(...) {
        // we don't bother checking too rigourously here, so
        // we might end up here ...
        std::cout << "Unknown failure, are the input files well-defined?";
        return -3;
    }

    std::cout << "Success (totally " << std::dec << comp.get_num_chunks() <<
        " chunks)" << std::endl;

    return 0;
}